

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant
          (ScalarEvolutionAnalysis *this,Instruction *inst)

{
  uint32_t uVar1;
  int iVar2;
  int32_t iVar3;
  SENode *pSVar4;
  ConstantManager *this_00;
  Constant *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong integer;
  ScalarConstant *this_01;
  
  if (inst->opcode_ != OpConstant) {
    if (inst->opcode_ != OpConstantNull) {
      __assert_fail("inst->opcode() == spv::Op::OpConstant",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                    ,200,
                    "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction *)"
                   );
    }
    integer = 0;
LAB_004fa950:
    pSVar4 = CreateConstant(this,integer);
    return pSVar4;
  }
  uVar1 = Instruction::NumInOperands(inst);
  if (uVar1 != 1) {
    __assert_fail("inst->NumInOperands() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                  ,0xc9,
                  "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction *)"
                 );
  }
  this_00 = IRContext::get_constant_mgr(this->context_);
  uVar1 = Instruction::result_id(inst);
  pCVar5 = analysis::ConstantManager::FindDeclaredConstant(this_00,uVar1);
  if (pCVar5 != (Constant *)0x0) {
    iVar2 = (*pCVar5->_vptr_Constant[0xe])(pCVar5);
    this_01 = (ScalarConstant *)CONCAT44(extraout_var,iVar2);
    if ((this_01 != (ScalarConstant *)0x0) &&
       (iVar2 = (*(this_01->super_Constant)._vptr_Constant[0x18])(this_01),
       ((long *)CONCAT44(extraout_var_00,iVar2))[1] - *(long *)CONCAT44(extraout_var_00,iVar2) == 4)
       ) {
      iVar2 = (*((this_01->super_Constant).type_)->_vptr_Type[10])();
      if (*(char *)(CONCAT44(extraout_var_01,iVar2) + 0x28) == '\x01') {
        iVar3 = analysis::IntConstant::GetS32BitValue((IntConstant *)this_01);
        integer = (ulong)iVar3;
      }
      else {
        uVar1 = analysis::ScalarConstant::GetU32BitValue(this_01);
        integer = (ulong)uVar1;
      }
      goto LAB_004fa950;
    }
  }
  return this->cached_cant_compute_;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction* inst) {
  if (inst->opcode() == spv::Op::OpConstantNull) return CreateConstant(0);

  assert(inst->opcode() == spv::Op::OpConstant);
  assert(inst->NumInOperands() == 1);
  int64_t value = 0;

  // Look up the instruction in the constant manager.
  const analysis::Constant* constant =
      context_->get_constant_mgr()->FindDeclaredConstant(inst->result_id());

  if (!constant) return CreateCantComputeNode();

  const analysis::IntConstant* int_constant = constant->AsIntConstant();

  // Exit out if it is a 64 bit integer.
  if (!int_constant || int_constant->words().size() != 1)
    return CreateCantComputeNode();

  if (int_constant->type()->AsInteger()->IsSigned()) {
    value = int_constant->GetS32BitValue();
  } else {
    value = int_constant->GetU32BitValue();
  }

  return CreateConstant(value);
}